

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O1

void __thiscall libtorrent::aux::bt_peer_connection::write_interested(bt_peer_connection *this)

{
  _List_node_base *p_Var1;
  
  send_message<>(this,msg_interested,num_outgoing_interested);
  for (p_Var1 = (this->super_peer_connection).m_extensions.
                super__List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&(this->super_peer_connection).m_extensions;
      p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x100))();
  }
  return;
}

Assistant:

void bt_peer_connection::write_interested()
	{
		INVARIANT_CHECK;

		send_message(msg_interested, counters::num_outgoing_interested);

#ifndef TORRENT_DISABLE_EXTENSIONS
		extension_notify(&peer_plugin::sent_interested);
#endif
	}